

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

void Image_Function::ProjectionProfile
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,bool horizontal,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *projection)

{
  byte bVar1;
  uint uVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  uchar *puVar6;
  uint uVar7;
  ulong uVar8;
  undefined3 in_register_00000089;
  uint8_t *imageX;
  uchar *puVar9;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(image,x,y,width,height);
  bVar1 = image->_colorCount;
  uVar7 = width * bVar1;
  uVar2 = height;
  if (CONCAT31(in_register_00000089,horizontal) != 0) {
    uVar2 = uVar7;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(projection,(ulong)uVar2);
  puVar3 = (projection->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar4 = (projection->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (puVar5 = puVar4; puVar5 != puVar3; puVar5 = puVar5 + 1) {
    *puVar5 = 0;
  }
  uVar2 = image->_rowSize;
  puVar9 = image->_data + (ulong)(bVar1 * x) + (ulong)(y * uVar2);
  if (horizontal) {
    puVar6 = puVar9 + uVar7;
    for (; puVar9 != puVar6; puVar9 = puVar9 + 1) {
      for (uVar8 = 0; height * uVar2 != uVar8; uVar8 = uVar8 + uVar2) {
        *puVar4 = *puVar4 + (uint)puVar9[uVar8];
      }
      puVar4 = puVar4 + 1;
    }
  }
  else {
    puVar6 = puVar9 + height * uVar2;
    for (; puVar9 != puVar6; puVar9 = puVar9 + uVar2) {
      for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        *puVar4 = *puVar4 + (uint)puVar9[uVar8];
      }
      puVar4 = puVar4 + 1;
    }
  }
  return;
}

Assistant:

void ProjectionProfile( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, bool horizontal,
                            std::vector < uint32_t > & projection )
    {
        ParameterValidation( image, x, y, width, height );

        const uint8_t colorCount = image.colorCount();

        projection.resize( horizontal ? width * colorCount : height );
        std::fill( projection.begin(), projection.end(), 0u );

        const uint32_t rowSize = image.rowSize();

        width = width * colorCount;

        if( horizontal ) {
            const uint8_t * imageX = image.data() + y * rowSize + x * colorCount;
            const uint8_t * imageXEnd = imageX + width;

            std::vector < uint32_t > ::iterator data = projection.begin();

            for( ; imageX != imageXEnd; ++imageX, ++data ) {
                const uint8_t * imageY    = imageX;
                const uint8_t * imageYEnd = imageY + height * rowSize;

                for( ; imageY != imageYEnd; imageY += rowSize )
                    (*data) += (*imageY);
            }
        }
        else {
            const uint8_t * imageY = image.data() + y * rowSize + x * colorCount;
            const uint8_t * imageYEnd = imageY + height * rowSize;

            std::vector < uint32_t > ::iterator data = projection.begin();

            for( ; imageY != imageYEnd; imageY += rowSize, ++data ) {
                const uint8_t * imageX    = imageY;
                const uint8_t * imageXEnd = imageX + width;

                for( ; imageX != imageXEnd; ++imageX )
                    (*data) += (*imageX);
            }
        }
    }